

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  SmallVector<unsigned_int,_8UL> *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ID id;
  BaseType BVar3;
  size_t sVar4;
  Variant *pVVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  CompilerMSL *pCVar18;
  undefined8 *puVar19;
  char cVar20;
  bool bVar21;
  char cVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  MSLConstexprSampler *pMVar25;
  mapped_type *pmVar26;
  const_iterator cVar27;
  mapped_type *pmVar28;
  undefined8 *puVar29;
  SPIRType *pSVar30;
  long *plVar31;
  SPIRType *pSVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  Bitset *pBVar34;
  _func_int **pp_Var35;
  char *__lhs;
  runtime_error *prVar36;
  uint uVar37;
  size_type *psVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  long *plVar40;
  SPIRVariable *pSVar41;
  __buckets_ptr *ppp_Var42;
  ulong *puVar43;
  uint uVar44;
  long lVar45;
  undefined8 *puVar46;
  ID *__k;
  uint32_t plane;
  undefined8 *puVar47;
  SPIRType *pSVar48;
  MSLConstexprSampler *pMVar49;
  __buckets_ptr pp_Var50;
  undefined8 uVar51;
  _Alloc_hider _Var52;
  pointer pcVar53;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  SPIRVariable *pSVar54;
  ulong uVar55;
  uint uVar56;
  long lVar57;
  ulong uVar58;
  byte bVar59;
  string __str;
  uint32_t var_id;
  string primary_name;
  char *cv_flags;
  string __str_1;
  __hashtable *__h;
  SmallVector<Resource,_8UL> resources;
  string local_418;
  string *local_3f8;
  string local_3f0;
  CompilerMSL *local_3d0;
  ID local_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [32];
  BaseType local_390;
  uint32_t local_38c;
  undefined8 local_388;
  string local_380;
  SPIRType *local_360;
  SPIRType *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  size_t local_348;
  undefined1 local_340 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *local_310;
  SPIRType *local_308;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_300;
  MSLConstexprSampler *local_2f8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2f0;
  SPIRType *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  uint local_2d8;
  undefined4 uStack_2d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  __buckets_ptr local_2b0;
  TypeID TStack_2a8;
  Dim DStack_2a4;
  SPIRType *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  long local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  undefined1 local_248 [536];
  
  bVar59 = 0;
  local_248._0_8_ = local_248 + 0x18;
  local_248._8_8_ = 0;
  local_248._16_8_ = 8;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  local_288.field_2._8_8_ = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_3f8 = ep_args;
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_288.field_2._8_8_);
  sVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_3d0 = this;
  if (sVar4 != 0) {
    local_310 = &this->entry_point_bindings;
    pSVar30 = (SPIRType *)
              (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pSVar48 = (SPIRType *)((long)(&(pSVar30->array).stack_storage + -2) + 8 + sVar4 * 4);
    local_2a0 = (SPIRType *)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_300 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&this->constexpr_samplers_by_id;
    local_2f0 = &(this->atomic_image_vars_emulated)._M_h;
    local_288.field_2._M_allocated_capacity =
         (size_type)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    local_2e8 = pSVar48;
    do {
      id.id = *(uint32_t *)&(pSVar30->super_IVariant)._vptr_IVariant;
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[id.id].type == TypeVariable) {
        local_308 = pSVar30;
        local_360 = (SPIRType *)Variant::get<spirv_cross::SPIRVariable>(pVVar5 + id.id);
        local_3f0._M_dataplus._M_p._0_4_ = id.id;
        pSVar30 = local_308;
        pSVar48 = local_2e8;
        if (((local_360->basetype < Float) &&
            ((0x1205U >> (local_360->basetype & (MeshGridProperties|Int)) & 1) != 0)) &&
           (bVar21 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)local_360,false),
           pSVar30 = local_308, pSVar48 = local_2e8, !bVar21)) {
          local_358 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)local_360);
          uVar23 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
          bVar21 = is_supported_argument_buffer_type(this,local_358);
          uVar51 = local_248._0_8_;
          BVar3 = local_360->basetype;
          if (((BVar3 == Int64 || !bVar21) || (7 < uVar23)) ||
             (((this->msl_options).argument_buffers == false ||
              ((this->argument_buffer_discrete_mask >> (uVar23 & 0x1f) & 1) != 0)))) {
            if ((BVar3 == Half) || (BVar3 == Boolean)) {
              if (local_248._8_8_ != 0) {
                lVar57 = local_248._8_8_ << 6;
                lVar45 = 0;
                do {
                  pCVar18 = local_3d0;
                  uVar23 = Compiler::get_decoration
                                     ((Compiler *)local_3d0,
                                      (ID)*(uint32_t *)
                                           (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)
                                                              (uVar51 + 0x20))->stack_storage + -2)
                                                      + 8 + lVar45) + 8),DecorationDescriptorSet);
                  uVar24 = Compiler::get_decoration((Compiler *)pCVar18,id,DecorationDescriptorSet);
                  pCVar18 = local_3d0;
                  if (uVar23 == uVar24) {
                    uVar23 = Compiler::get_decoration
                                       ((Compiler *)local_3d0,
                                        (ID)*(uint32_t *)
                                             (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)
                                                                (uVar51 + 0x20))->stack_storage + -2
                                                              ) + 8 + lVar45) + 8),Binding);
                    uVar24 = Compiler::get_decoration((Compiler *)pCVar18,id,Binding);
                    if (((uVar23 == uVar24) &&
                        (*(int *)((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->
                                          stack_storage + -1) + 0x18 + lVar45) == 0xf)) &&
                       (local_358->basetype == Struct)) {
                      pSVar54 = *(SPIRVariable **)
                                 ((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->
                                          stack_storage + -2) + 8 + lVar45);
                      if ((pSVar54->storage == StorageBuffer) ||
                         (pSVar54->storage == StorageClassUniform)) {
                        *(SPIRVariable **)
                         ((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->stack_storage
                                + -2) + 0x10 + lVar45) = pSVar54;
                        cVar27 = ::std::
                                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                         *)local_2a0,(key_type *)&local_3f0);
                        this = local_3d0;
                        if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                            (__node_type *)0x0) {
                          local_380._M_dataplus._M_p._0_4_ =
                               *(undefined4 *)
                                (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)
                                                   (uVar51 + 0x20))->stack_storage + -2) + 8 +
                                          lVar45) + 8);
                          local_3c0._0_8_ = local_2a0;
                          ::std::
                          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          ::
                          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                      *)local_2a0,local_3b0 + 0x30,local_3c0);
                        }
                        goto LAB_0024d3cb;
                      }
                    }
                  }
                  lVar45 = lVar45 + 0x40;
                } while (lVar57 != lVar45);
              }
              pSVar54 = (SPIRVariable *)0x0;
              this = local_3d0;
            }
            else {
              pSVar54 = (SPIRVariable *)0x0;
            }
LAB_0024d3cb:
            if (local_358->basetype - SampledImage < 2) {
              pMVar25 = find_constexpr_sampler(this,local_3f0._M_dataplus._M_p._0_4_);
              if (pMVar25 == (MSLConstexprSampler *)0x0) goto LAB_0024d413;
              pmVar26 = ::std::
                        map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                        ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                      *)local_300,(key_type *)&local_3f0);
              pMVar49 = pMVar25;
              for (lVar45 = 0x19; lVar45 != 0; lVar45 = lVar45 + -1) {
                pmVar26->coord = pMVar49->coord;
                pMVar49 = (MSLConstexprSampler *)((long)pMVar49 + (ulong)bVar59 * -8 + 4);
                pmVar26 = (mapped_type *)((long)pmVar26 + (ulong)bVar59 * -8 + 4);
              }
            }
            else {
LAB_0024d413:
              pMVar25 = (MSLConstexprSampler *)0x0;
            }
            local_3c0._0_4_ = (local_360->super_IVariant).self.id;
            cVar27 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(local_2f0,(key_type *)local_3c0);
            if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
            {
              uVar23 = 0;
            }
            else {
              uVar23 = get_metal_resource_index(this,(SPIRVariable *)local_360,AtomicCounter,0);
            }
            if (local_358->basetype == SampledImage) {
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,local_3f0._M_dataplus._M_p._0_4_);
              uVar24 = 1;
              if ((pMVar25 != (MSLConstexprSampler *)0x0) &&
                 (pMVar25->ycbcr_conversion_enable == true)) {
                uVar24 = pMVar25->planes;
              }
              local_2f8 = pMVar25;
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_310,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4]
                   = (SPIRVariable *)local_360;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar4 + 1;
              if (uVar24 != 0) {
                plane = 0;
                do {
                  pSVar48 = local_360;
                  local_3c0._0_8_ = local_360;
                  local_3c0._8_8_ = pSVar54;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_3b0,this,(ulong)local_3f0._M_dataplus._M_p & 0xffffffff,1);
                  local_390 = Image;
                  local_38c = get_metal_resource_index(this,(SPIRVariable *)pSVar48,Image,plane);
                  local_388 = CONCAT44(uVar23,plane);
                  SmallVector<Resource,_8UL>::push_back
                            ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3c0);
                  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                    operator_delete((void *)local_3b0._0_8_);
                  }
                  plane = plane + 1;
                } while (uVar24 != plane);
              }
              pSVar30 = local_308;
              pSVar48 = local_2e8;
              if ((local_2f8 == (MSLConstexprSampler *)0x0) && ((local_358->image).dim != Buffer)) {
                local_3c0._0_8_ = local_360;
                local_3c0._8_8_ = pSVar54;
                to_sampler_expression_abi_cxx11_
                          ((string *)local_3b0,this,local_3f0._M_dataplus._M_p._0_4_);
                local_390 = Sampler;
                local_38c = get_metal_resource_index(this,(SPIRVariable *)local_360,Sampler,0);
                local_388 = 0;
LAB_0024d6ae:
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3c0);
                pSVar30 = local_308;
                pSVar48 = local_2e8;
                if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                  operator_delete((void *)local_3b0._0_8_);
                  pSVar30 = local_308;
                  pSVar48 = local_2e8;
                }
              }
            }
            else {
              pSVar30 = local_308;
              pSVar48 = local_2e8;
              if (pMVar25 == (MSLConstexprSampler *)0x0) {
                CompilerGLSL::add_resource_name
                          (&this->super_CompilerGLSL,local_3f0._M_dataplus._M_p._0_4_);
                uVar24 = 0xffffffff;
                if (pSVar54 == (SPIRVariable *)0x0) {
                  uVar24 = get_metal_resource_index
                                     (this,(SPIRVariable *)local_360,local_358->basetype,0);
                }
                SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                          (local_310,
                           (this->entry_point_bindings).
                           super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size + 1);
                sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                        buffer_size;
                (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr
                [sVar4] = (SPIRVariable *)local_360;
                (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                buffer_size = sVar4 + 1;
                local_3c0._0_8_ = local_360;
                local_3c0._8_8_ = pSVar54;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_3b0,this,(ulong)local_3f0._M_dataplus._M_p & 0xffffffff,1);
                local_390 = local_358->basetype;
                local_388 = (ulong)uVar23 << 0x20;
                local_38c = uVar24;
                goto LAB_0024d6ae;
              }
            }
          }
          else {
            bVar21 = is_var_runtime_size_array(this,(SPIRVariable *)local_360);
            pSVar32 = local_360;
            pSVar30 = local_308;
            pSVar48 = local_2e8;
            if (bVar21) {
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_310,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4]
                   = (SPIRVariable *)pSVar32;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar4 + 1;
              local_3c0._0_4_ = id.id;
              pmVar28 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_288.field_2._M_allocated_capacity,
                                     (key_type *)local_3c0);
              (pmVar28->decoration).qualified_alias_explicit_override = true;
              pSVar30 = local_308;
              pSVar48 = local_2e8;
            }
          }
        }
      }
      pSVar30 = (SPIRType *)((long)&(pSVar30->super_IVariant)._vptr_IVariant + 4);
    } while (pSVar30 != pSVar48);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_418);
  uVar51 = local_248._0_8_;
  lVar45 = (long)(local_248._0_8_ + 0x20) + local_248._8_8_ * 0x40 + -0x20;
  if (local_248._8_8_ != 0) {
    uVar58 = local_248._8_8_;
    if (0 < (long)local_248._8_8_) {
LAB_0024d7eb:
      uVar55 = uVar58 + 1 >> 1;
      puVar29 = (undefined8 *)operator_new(uVar55 << 6,(nothrow_t *)&::std::nothrow);
      if (puVar29 == (undefined8 *)0x0) goto code_r0x0024d806;
      uVar17 = *(undefined8 *)&((IVariant *)uVar51)->self;
      *puVar29 = ((IVariant *)uVar51)->_vptr_IVariant;
      puVar29[1] = uVar17;
      puVar47 = puVar29 + 4;
      puVar29[2] = puVar47;
      pSVar1 = (SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20);
      if ((SmallVector<unsigned_int,_8UL> *)*(undefined1 **)(uVar51 + 0x10) == pSVar1) {
        sVar4 = (((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->super_VectorView<unsigned_int>
                ).buffer_size;
        *puVar47 = (pSVar1->super_VectorView<unsigned_int>).ptr;
        puVar29[5] = sVar4;
      }
      else {
        puVar29[2] = *(undefined1 **)(uVar51 + 0x10);
        puVar29[4] = (pSVar1->super_VectorView<unsigned_int>).ptr;
      }
      puVar29[3] = *(undefined8 *)(uVar51 + 0x18);
      *(SmallVector<unsigned_int,_8UL> **)(uVar51 + 0x10) = pSVar1;
      *(undefined8 *)(uVar51 + 0x18) = 0;
      *(undefined1 *)
       &(((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->super_VectorView<unsigned_int>).ptr =
           0;
      local_360 = (SPIRType *)&((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->buffer_capacity;
      uVar17 = *(undefined8 *)
                (((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->stack_storage).aligned_char;
      puVar29[6] = ((SmallVector<unsigned_int,_8UL> *)(uVar51 + 0x20))->buffer_capacity;
      puVar29[7] = uVar17;
      puVar46 = puVar29;
      if (uVar55 != 1) {
        lVar57 = (uVar58 * 0x20 + 0x20 & 0xffffffffffffffc0) - 0x40;
        puVar19 = puVar29 + 0xc;
        do {
          puVar46 = puVar19;
          puVar46[-4] = puVar46[-0xc];
          puVar46[-3] = puVar46[-0xb];
          puVar46[-2] = puVar46;
          puVar19 = puVar46 + -8;
          if (puVar19 == (undefined8 *)puVar46[-10]) {
            *puVar46 = *puVar19;
            puVar46[1] = puVar46[-7];
          }
          else {
            puVar46[-2] = (undefined8 *)puVar46[-10];
            *puVar46 = puVar46[-8];
          }
          puVar46[-1] = puVar46[-9];
          puVar46[-10] = puVar19;
          puVar46[-9] = 0;
          *(undefined1 *)(puVar46 + -8) = 0;
          puVar46[2] = puVar46[-6];
          puVar46[3] = puVar46[-5];
          lVar57 = lVar57 + -0x40;
          puVar19 = puVar46 + 8;
        } while (lVar57 != 0);
        puVar46 = puVar46 + -4;
      }
      uVar17 = puVar46[1];
      local_358 = (SPIRType *)uVar51;
      ((IVariant *)uVar51)->_vptr_IVariant = (_func_int **)*puVar46;
      *(undefined8 *)&((IVariant *)uVar51)->self = uVar17;
      ::std::__cxx11::string::operator=((string *)(uVar51 + 0x10),(string *)(puVar46 + 2));
      uVar15 = *(undefined4 *)((long)puVar46 + 0x34);
      uVar23 = *(uint32_t *)(puVar46 + 7);
      uVar16 = *(undefined4 *)((long)puVar46 + 0x3c);
      *(undefined4 *)&(local_360->super_IVariant)._vptr_IVariant = *(undefined4 *)(puVar46 + 6);
      *(undefined4 *)((long)&(local_360->super_IVariant)._vptr_IVariant + 4) = uVar15;
      (local_360->super_IVariant).self.id = uVar23;
      *(undefined4 *)&(local_360->super_IVariant).field_0xc = uVar16;
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (local_358,lVar45,puVar29,uVar55);
      uVar58 = uVar58 * 0x20 + 0x20 & 0xffffffffffffffc0;
      do {
        if (puVar47 != (undefined8 *)puVar47[-2]) {
          operator_delete((undefined8 *)puVar47[-2]);
        }
        puVar47 = puVar47 + 8;
        uVar58 = uVar58 - 0x40;
      } while (uVar58 != 0);
      goto LAB_0024d965;
    }
LAB_0024d80f:
    ::std::
    __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
              (uVar51,lVar45);
    puVar29 = (undefined8 *)0x0;
LAB_0024d965:
    operator_delete(puVar29);
    if (local_248._8_8_ != 0) {
      local_360 = (SPIRType *)((long)(local_248._0_8_ + 0x20) + local_248._8_8_ * 0x40 + -0x20);
      local_2f8 = (MSLConstexprSampler *)&local_3d0->plane_name_suffix;
      local_358 = (SPIRType *)&(local_3d0->super_CompilerGLSL).super_Compiler.interlocked_resources;
      local_2f0 = &(local_3d0->atomic_image_vars_emulated)._M_h;
      local_2e8 = (SPIRType *)&(local_3d0->super_CompilerGLSL).super_Compiler.ir.meta;
      local_310 = (SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)
                  &local_3d0->buffer_aliases_discrete;
      local_300 = &(local_3d0->recursive_inputs)._M_h;
      pSVar48 = (SPIRType *)local_248._0_8_;
      do {
        pSVar54 = (SPIRVariable *)(pSVar48->super_IVariant)._vptr_IVariant;
        pSVar30 = Compiler::get_variable_data_type((Compiler *)local_3d0,pSVar54);
        local_3c4.id = (pSVar54->super_IVariant).self.id;
        switch((int)(pSVar48->array).buffer_capacity) {
        case 0xf:
          __k = &(pSVar30->super_IVariant).self;
          pmVar28 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_2e8,__k);
          pCVar18 = local_3d0;
          if ((pmVar28->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
            pp_Var6 = *(_func_int ***)&(pSVar48->super_IVariant).self;
            if (pp_Var6 == (_func_int **)0x0) {
              sVar4 = (pSVar30->array).super_VectorView<unsigned_int>.buffer_size;
              if (sVar4 == 0) {
                if (local_3f8->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3f8);
                }
                get_argument_address_space_abi_cxx11_(&local_418,local_3d0,pSVar54);
                plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                local_3c0._0_8_ = local_3b0;
                pSVar54 = (SPIRVariable *)(plVar31 + 2);
                if ((SPIRVariable *)*plVar31 == pSVar54) {
                  local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar31[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                }
                paVar33 = &local_418.field_2;
                local_3c0._8_8_ = plVar31[1];
                *plVar31 = (long)pSVar54;
                plVar31[1] = 0;
                *(undefined1 *)(plVar31 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar33) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                local_3c0._0_4_ = __k->id;
                cVar27 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(local_300,(key_type *)local_3c0);
                if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                    (__node_type *)0x0) {
                  (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (local_3b0 + 0x30,local_3d0,pSVar30,0);
                  puVar29 = (undefined8 *)::std::__cxx11::string::append(local_3b0 + 0x30);
                  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                  psVar38 = puVar29 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_3f0.field_2._M_allocated_capacity = *psVar38;
                    local_3f0.field_2._8_8_ = puVar29[3];
                  }
                  else {
                    local_3f0.field_2._M_allocated_capacity = *psVar38;
                    local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                  }
                  local_3f0._M_string_length = puVar29[1];
                  *puVar29 = psVar38;
                  puVar29[1] = 0;
                  *(undefined1 *)(puVar29 + 2) = 0;
                  to_restrict(local_3d0,local_3c4.id,true);
                  puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3f0);
                  psVar38 = puVar29 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418.field_2._8_8_ = puVar29[3];
                    local_418._M_dataplus._M_p = (pointer)paVar33;
                  }
                  else {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418._M_dataplus._M_p = (pointer)*puVar29;
                  }
                  local_418._M_string_length = puVar29[1];
                  *puVar29 = psVar38;
                  puVar29[1] = 0;
                  *(undefined1 *)(puVar29 + 2) = 0;
                  uVar14._0_4_ = pSVar48->basetype;
                  uVar14._4_4_ = pSVar48->width;
                  plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar14);
                  local_3c0._0_8_ = local_3b0;
                  pSVar54 = (SPIRVariable *)(plVar31 + 2);
                  if ((SPIRVariable *)*plVar31 == pSVar54) {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar31[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                  }
                  local_3c0._8_8_ = plVar31[1];
                  *plVar31 = (long)pSVar54;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                }
                else {
                  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_3b0 + 0x30),"void* ","");
                  to_restrict(local_3d0,local_3c4.id,true);
                  puVar29 = (undefined8 *)::std::__cxx11::string::append(local_3b0 + 0x30);
                  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                  psVar38 = puVar29 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_3f0.field_2._M_allocated_capacity = *psVar38;
                    local_3f0.field_2._8_8_ = puVar29[3];
                  }
                  else {
                    local_3f0.field_2._M_allocated_capacity = *psVar38;
                    local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                  }
                  local_3f0._M_string_length = puVar29[1];
                  *puVar29 = psVar38;
                  puVar29[1] = 0;
                  *(undefined1 *)(puVar29 + 2) = 0;
                  uVar13._0_4_ = pSVar48->basetype;
                  uVar13._4_4_ = pSVar48->width;
                  plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_3f0,uVar13);
                  psVar38 = (size_type *)(plVar31 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar31 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418.field_2._8_8_ = plVar31[3];
                    local_418._M_dataplus._M_p = (pointer)paVar33;
                  }
                  else {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418._M_dataplus._M_p = (pointer)*plVar31;
                  }
                  local_418._M_string_length = plVar31[1];
                  *plVar31 = (long)psVar38;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                  local_3c0._0_8_ = local_3b0;
                  pSVar54 = (SPIRVariable *)(plVar31 + 2);
                  if ((SPIRVariable *)*plVar31 == pSVar54) {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar31[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                  }
                  local_3c0._8_8_ = plVar31[1];
                  *plVar31 = (long)pSVar54;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                }
                if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar33) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                  operator_delete(local_3f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p);
                }
                uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
                cVar22 = '\x01';
                if (9 < uVar56) {
                  uVar44 = uVar56;
                  cVar20 = '\x04';
                  do {
                    cVar22 = cVar20;
                    if (uVar44 < 100) {
                      cVar22 = cVar22 + -2;
                      goto LAB_00250858;
                    }
                    if (uVar44 < 1000) {
                      cVar22 = cVar22 + -1;
                      goto LAB_00250858;
                    }
                    if (uVar44 < 10000) goto LAB_00250858;
                    bVar21 = 99999 < uVar44;
                    uVar44 = uVar44 / 10000;
                    cVar20 = cVar22 + '\x04';
                  } while (bVar21);
                  cVar22 = cVar22 + '\x01';
                }
LAB_00250858:
                local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
                puVar29 = (undefined8 *)
                          ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558f);
                psVar38 = puVar29 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar38) {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418.field_2._8_8_ = puVar29[3];
                  local_418._M_dataplus._M_p = (pointer)paVar33;
                }
                else {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418._M_dataplus._M_p = (pointer)*puVar29;
                }
                local_418._M_string_length = puVar29[1];
                *puVar29 = psVar38;
                puVar29[1] = 0;
                *(undefined1 *)(puVar29 + 2) = 0;
                plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                local_3c0._0_8_ = local_3b0;
                pSVar30 = (SPIRType *)(plVar31 + 2);
                if ((SPIRType *)*plVar31 == pSVar30) {
                  local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar31[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRType *)*plVar31;
                }
                local_3c0._8_8_ = plVar31[1];
                *plVar31 = (long)pSVar30;
                plVar31[1] = 0;
                *(undefined1 *)(plVar31 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar33) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                  operator_delete(local_3f0._M_dataplus._M_p);
                }
                cVar27 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_358,&local_3c4.id);
                if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::__cxx11::string::append((char *)local_3f8);
                }
                ::std::__cxx11::string::append((char *)local_3f8);
              }
              else {
                if (sVar4 != 1) {
                  prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ::std::runtime_error::runtime_error
                            (prVar36,"Arrays of arrays of buffers are not supported.");
                  *(undefined ***)prVar36 = &PTR__runtime_error_0048ff00;
                  __cxa_throw(prVar36,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                local_3d0->is_using_builtin_array = true;
                bVar21 = is_var_runtime_size_array(local_3d0,pSVar54);
                if (bVar21) {
                  add_spv_func_and_recompile(local_3d0,SPVFuncImplVariableDescriptorArray);
                  if (local_3f8->_M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)local_3f8);
                  }
                  bVar21 = Compiler::has_decoration((Compiler *)local_3d0,(ID)__k->id,BufferBlock);
                  if (((~bVar21 & pSVar54->storage != StorageBuffer) == 0) &&
                     ((local_3d0->msl_options).runtime_array_rich_descriptor == true)) {
                    add_spv_func_and_recompile(local_3d0,SPVFuncImplVariableSizedDescriptor);
                    get_argument_address_space_abi_cxx11_
                              ((string *)(local_340 + 0x10),local_3d0,pSVar54);
                    puVar29 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)(local_340 + 0x10),0,(char *)0x0,0x39554b);
                    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                    plVar31 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar31) {
                      local_380.field_2._M_allocated_capacity = *plVar31;
                      local_380.field_2._8_8_ = puVar29[3];
                    }
                    else {
                      local_380.field_2._M_allocated_capacity = *plVar31;
                      local_380._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_380._M_string_length = puVar29[1];
                    *puVar29 = plVar31;
                    puVar29[1] = 0;
                    *(undefined1 *)(puVar29 + 2) = 0;
                    puVar29 = (undefined8 *)::std::__cxx11::string::append(local_3b0 + 0x30);
                    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                    psVar38 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar38) {
                      local_3f0.field_2._M_allocated_capacity = *psVar38;
                      local_3f0.field_2._8_8_ = puVar29[3];
                    }
                    else {
                      local_3f0.field_2._M_allocated_capacity = *psVar38;
                      local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_3f0._M_string_length = puVar29[1];
                    *puVar29 = psVar38;
                    puVar29[1] = 0;
                    *(undefined1 *)(puVar29 + 2) = 0;
                    (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                              (&local_350,local_3d0,pSVar30,0);
                    uVar51 = (pointer)0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                      uVar51 = local_3f0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar51 < (pointer)(local_348 + local_3f0._M_string_length)) {
                      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_340;
                      pcVar53 = (pointer)0xf;
                      if (local_350 != in_R9) {
                        pcVar53 = (pointer)local_340._0_8_;
                      }
                      if (pcVar53 < (pointer)(local_348 + local_3f0._M_string_length))
                      goto LAB_00250b65;
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_350,0,(char *)0x0,
                                           (ulong)local_3f0._M_dataplus._M_p);
                    }
                    else {
LAB_00250b65:
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_3f0,(ulong)local_350);
                    }
                    psVar38 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar38) {
                      local_418.field_2._M_allocated_capacity = *psVar38;
                      local_418.field_2._8_8_ = puVar29[3];
                      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                    }
                    else {
                      local_418.field_2._M_allocated_capacity = *psVar38;
                      local_418._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_418._M_string_length = puVar29[1];
                    *puVar29 = psVar38;
                    puVar29[1] = 0;
                    *(undefined1 *)psVar38 = 0;
                    plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                    local_3c0._0_8_ = local_3b0;
                    pSVar54 = (SPIRVariable *)(plVar31 + 2);
                    if ((SPIRVariable *)*plVar31 == pSVar54) {
                      local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                      local_3b0._8_8_ = plVar31[3];
                    }
                    else {
                      local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                      local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                    }
                    local_3c0._8_8_ = plVar31[1];
                    *plVar31 = (long)pSVar54;
                    plVar31[1] = 0;
                    *(undefined1 *)(plVar31 + 2) = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                  }
                  else {
                    add_spv_func_and_recompile(local_3d0,SPVFuncImplVariableDescriptor);
                    get_argument_address_space_abi_cxx11_
                              ((string *)(local_340 + 0x10),local_3d0,pSVar54);
                    puVar29 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)(local_340 + 0x10),0,(char *)0x0,0x395572);
                    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                    plVar31 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar31) {
                      local_380.field_2._M_allocated_capacity = *plVar31;
                      local_380.field_2._8_8_ = puVar29[3];
                    }
                    else {
                      local_380.field_2._M_allocated_capacity = *plVar31;
                      local_380._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_380._M_string_length = puVar29[1];
                    *puVar29 = plVar31;
                    puVar29[1] = 0;
                    *(undefined1 *)(puVar29 + 2) = 0;
                    puVar29 = (undefined8 *)::std::__cxx11::string::append(local_3b0 + 0x30);
                    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                    psVar38 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar38) {
                      local_3f0.field_2._M_allocated_capacity = *psVar38;
                      local_3f0.field_2._8_8_ = puVar29[3];
                    }
                    else {
                      local_3f0.field_2._M_allocated_capacity = *psVar38;
                      local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_3f0._M_string_length = puVar29[1];
                    *puVar29 = psVar38;
                    puVar29[1] = 0;
                    *(undefined1 *)(puVar29 + 2) = 0;
                    (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                              (&local_350,local_3d0,pSVar30,0);
                    uVar51 = (pointer)0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                      uVar51 = local_3f0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar51 < (pointer)(local_348 + local_3f0._M_string_length)) {
                      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_340;
                      pcVar53 = (pointer)0xf;
                      if (local_350 != in_R9) {
                        pcVar53 = (pointer)local_340._0_8_;
                      }
                      if (pcVar53 < (pointer)(local_348 + local_3f0._M_string_length))
                      goto LAB_0025071f;
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_350,0,(char *)0x0,
                                           (ulong)local_3f0._M_dataplus._M_p);
                    }
                    else {
LAB_0025071f:
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_3f0,(ulong)local_350);
                    }
                    psVar38 = puVar29 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar29 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar38) {
                      local_418.field_2._M_allocated_capacity = *psVar38;
                      local_418.field_2._8_8_ = puVar29[3];
                      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                    }
                    else {
                      local_418.field_2._M_allocated_capacity = *psVar38;
                      local_418._M_dataplus._M_p = (pointer)*puVar29;
                    }
                    local_418._M_string_length = puVar29[1];
                    *puVar29 = psVar38;
                    puVar29[1] = 0;
                    *(undefined1 *)psVar38 = 0;
                    plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                    local_3c0._0_8_ = local_3b0;
                    pSVar54 = (SPIRVariable *)(plVar31 + 2);
                    if ((SPIRVariable *)*plVar31 == pSVar54) {
                      local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                      local_3b0._8_8_ = plVar31[3];
                    }
                    else {
                      local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                      local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                    }
                    local_3c0._8_8_ = plVar31[1];
                    *plVar31 = (long)pSVar54;
                    plVar31[1] = 0;
                    *(undefined1 *)(plVar31 + 2) = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                  }
                  paVar33 = &local_418.field_2;
                  if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                    operator_delete((void *)local_3c0._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != paVar33) {
                    operator_delete(local_418._M_dataplus._M_p);
                  }
                  if (local_350 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340
                     ) {
                    operator_delete(local_350);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                    operator_delete(local_3f0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_380._M_dataplus._M_p != &local_380.field_2) {
                    operator_delete(local_380._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._16_8_ != &local_320) {
                    operator_delete((void *)local_340._16_8_);
                  }
                  __lhs = to_restrict(local_3d0,local_3c4.id,true);
                  ::std::operator+(&local_418,__lhs,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pSVar48->basetype);
                  plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                  local_3c0._0_8_ = local_3b0;
                  pSVar54 = (SPIRVariable *)(plVar31 + 2);
                  if ((SPIRVariable *)*plVar31 == pSVar54) {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar31[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                  }
                  local_3c0._8_8_ = plVar31[1];
                  *plVar31 = (long)pSVar54;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                  if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                    operator_delete((void *)local_3c0._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != paVar33) {
                    operator_delete(local_418._M_dataplus._M_p);
                  }
                  uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
                  cVar22 = '\x01';
                  if (9 < uVar56) {
                    uVar44 = uVar56;
                    cVar20 = '\x04';
                    do {
                      cVar22 = cVar20;
                      if (uVar44 < 100) {
                        cVar22 = cVar22 + -2;
                        goto LAB_00250daf;
                      }
                      if (uVar44 < 1000) {
                        cVar22 = cVar22 + -1;
                        goto LAB_00250daf;
                      }
                      if (uVar44 < 10000) goto LAB_00250daf;
                      bVar21 = 99999 < uVar44;
                      uVar44 = uVar44 / 10000;
                      cVar20 = cVar22 + '\x04';
                    } while (bVar21);
                    cVar22 = cVar22 + '\x01';
                  }
LAB_00250daf:
                  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                  ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
                  ::std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
                  puVar29 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_3f0,0,(char *)0x0,0x39558f);
                  psVar38 = puVar29 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar38) {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418.field_2._8_8_ = puVar29[3];
                    local_418._M_dataplus._M_p = (pointer)paVar33;
                  }
                  else {
                    local_418.field_2._M_allocated_capacity = *psVar38;
                    local_418._M_dataplus._M_p = (pointer)*puVar29;
                  }
                  local_418._M_string_length = puVar29[1];
                  *puVar29 = psVar38;
                  puVar29[1] = 0;
                  *(undefined1 *)(puVar29 + 2) = 0;
                  plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                  local_3c0._0_8_ = local_3b0;
                  pSVar30 = (SPIRType *)(plVar31 + 2);
                  if ((SPIRType *)*plVar31 == pSVar30) {
                    local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar31[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRType *)*plVar31;
                  }
                  local_3c0._8_8_ = plVar31[1];
                  *plVar31 = (long)pSVar30;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                  if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
                    operator_delete((void *)local_3c0._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != paVar33) {
                    operator_delete(local_418._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                    operator_delete(local_3f0._M_dataplus._M_p);
                  }
                  cVar27 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)local_358,&local_3c4.id);
                  if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                      (__node_type *)0x0) {
                    ::std::__cxx11::string::append((char *)local_3f8);
                  }
                  ::std::__cxx11::string::append((char *)local_3f8);
                }
                else {
                  uVar23 = get_resource_array_size(local_3d0,pSVar30,local_3c4.id);
                  if (uVar23 != 0) {
                    uVar56 = 0;
                    local_308 = pSVar30;
                    do {
                      if (local_3f8->_M_string_length != 0) {
                        ::std::__cxx11::string::append((char *)local_3f8);
                      }
                      get_argument_address_space_abi_cxx11_(&local_268,local_3d0,pSVar54);
                      plVar31 = (long *)::std::__cxx11::string::append((char *)&local_268);
                      local_2d0.field_2._M_allocated_capacity = (size_type)&local_2b0;
                      ppp_Var42 = (__buckets_ptr *)(plVar31 + 2);
                      if ((__buckets_ptr *)*plVar31 == ppp_Var42) {
                        local_2b0 = *ppp_Var42;
                        TStack_2a8.id = *(uint32_t *)(plVar31 + 3);
                        DStack_2a4 = *(Dim *)((long)plVar31 + 0x1c);
                      }
                      else {
                        local_2b0 = *ppp_Var42;
                        local_2d0.field_2._M_allocated_capacity =
                             (size_type)(__buckets_ptr *)*plVar31;
                      }
                      local_2d0.field_2._8_8_ = plVar31[1];
                      *plVar31 = (long)ppp_Var42;
                      plVar31[1] = 0;
                      *(undefined1 *)(plVar31 + 2) = 0;
                      (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                                (&local_298,local_3d0,pSVar30,0);
                      pp_Var50 = (__buckets_ptr)0xf;
                      if ((__buckets_ptr *)local_2d0.field_2._M_allocated_capacity != &local_2b0) {
                        pp_Var50 = local_2b0;
                      }
                      if (pp_Var50 < (__buckets_ptr)(local_290 + local_2d0.field_2._8_8_)) {
                        in_R9 = &local_288;
                        _Var52._M_p = (pointer)(__buckets_ptr)0xf;
                        if (local_298 != in_R9) {
                          _Var52._M_p = local_288._M_dataplus._M_p;
                        }
                        if (_Var52._M_p < (__buckets_ptr)(local_290 + local_2d0.field_2._8_8_))
                        goto LAB_0024f309;
                        plVar31 = (long *)::std::__cxx11::string::replace
                                                    ((ulong)&local_298,0,(char *)0x0,
                                                     local_2d0.field_2._M_allocated_capacity);
                      }
                      else {
LAB_0024f309:
                        plVar31 = (long *)::std::__cxx11::string::_M_append
                                                    (local_2d0.field_2._M_local_buf,(ulong)local_298
                                                    );
                      }
                      local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_340;
                      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (plVar31 + 2);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          *plVar31 == pbVar2) {
                        local_340._0_8_ = (pbVar2->_M_dataplus)._M_p;
                        local_340._8_8_ = plVar31[3];
                      }
                      else {
                        local_340._0_8_ = (pbVar2->_M_dataplus)._M_p;
                        local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)*plVar31;
                      }
                      local_348 = plVar31[1];
                      *plVar31 = (long)pbVar2;
                      plVar31[1] = 0;
                      *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
                      puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)&local_350);
                      local_340._16_8_ = &local_320;
                      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar29 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar29 == paVar33) {
                        local_320._M_allocated_capacity = paVar33->_M_allocated_capacity;
                        local_320._8_8_ = puVar29[3];
                      }
                      else {
                        local_320._M_allocated_capacity = paVar33->_M_allocated_capacity;
                        local_340._16_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)*puVar29;
                      }
                      local_340._24_8_ = puVar29[1];
                      *puVar29 = paVar33;
                      puVar29[1] = 0;
                      *(undefined1 *)(puVar29 + 2) = 0;
                      to_restrict(local_3d0,local_3c4.id,true);
                      puVar29 = (undefined8 *)::std::__cxx11::string::append(local_340 + 0x10);
                      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                      plVar31 = puVar29 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar29 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)plVar31) {
                        local_380.field_2._M_allocated_capacity = *plVar31;
                        local_380.field_2._8_8_ = puVar29[3];
                      }
                      else {
                        local_380.field_2._M_allocated_capacity = *plVar31;
                        local_380._M_dataplus._M_p = (pointer)*puVar29;
                      }
                      local_380._M_string_length = puVar29[1];
                      *puVar29 = plVar31;
                      puVar29[1] = 0;
                      *(undefined1 *)(puVar29 + 2) = 0;
                      uVar12._0_4_ = pSVar48->basetype;
                      uVar12._4_4_ = pSVar48->width;
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::_M_append(local_3b0 + 0x30,uVar12);
                      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                      psVar38 = puVar29 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar29 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar38) {
                        local_3f0.field_2._M_allocated_capacity = *psVar38;
                        local_3f0.field_2._8_8_ = puVar29[3];
                      }
                      else {
                        local_3f0.field_2._M_allocated_capacity = *psVar38;
                        local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                      }
                      local_3f0._M_string_length = puVar29[1];
                      *puVar29 = psVar38;
                      puVar29[1] = 0;
                      *(undefined1 *)(puVar29 + 2) = 0;
                      plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
                      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                      puVar43 = (ulong *)(plVar31 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar31 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)puVar43) {
                        local_418.field_2._M_allocated_capacity = *puVar43;
                        local_418.field_2._8_8_ = plVar31[3];
                      }
                      else {
                        local_418.field_2._M_allocated_capacity = *puVar43;
                        local_418._M_dataplus._M_p = (pointer)*plVar31;
                      }
                      local_418._M_string_length = plVar31[1];
                      *plVar31 = (long)puVar43;
                      plVar31[1] = 0;
                      *(undefined1 *)(plVar31 + 2) = 0;
                      cVar22 = '\x01';
                      if (9 < uVar56) {
                        uVar58 = (ulong)uVar56;
                        cVar20 = '\x04';
                        do {
                          cVar22 = cVar20;
                          uVar44 = (uint)uVar58;
                          if (uVar44 < 100) {
                            cVar22 = cVar22 + -2;
                            goto LAB_0024f561;
                          }
                          if (uVar44 < 1000) {
                            cVar22 = cVar22 + -1;
                            goto LAB_0024f561;
                          }
                          if (uVar44 < 10000) goto LAB_0024f561;
                          uVar58 = uVar58 / 10000;
                          cVar20 = cVar22 + '\x04';
                        } while (99999 < uVar44);
                        cVar22 = cVar22 + '\x01';
                      }
LAB_0024f561:
                      local_2e0 = &local_2d0;
                      ::std::__cxx11::string::_M_construct((ulong)&local_2e0,cVar22);
                      ::std::__detail::__to_chars_10_impl<unsigned_int>
                                ((char *)local_2e0,local_2d8,uVar56);
                      uVar51 = (pointer)0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_418._M_dataplus._M_p != &local_418.field_2) {
                        uVar51 = local_418.field_2._M_allocated_capacity;
                      }
                      pcVar53 = (pointer)(CONCAT44(uStack_2d4,local_2d8) +
                                         local_418._M_string_length);
                      if ((ulong)uVar51 < pcVar53) {
                        in_R9 = &local_2d0;
                        _Var52._M_p = (pointer)0xf;
                        if (local_2e0 != in_R9) {
                          _Var52._M_p = local_2d0._M_dataplus._M_p;
                        }
                        if (_Var52._M_p < pcVar53) goto LAB_0024f5ee;
                        plVar31 = (long *)::std::__cxx11::string::replace
                                                    ((ulong)&local_2e0,0,(char *)0x0,
                                                     (ulong)local_418._M_dataplus._M_p);
                      }
                      else {
LAB_0024f5ee:
                        plVar31 = (long *)::std::__cxx11::string::_M_append
                                                    ((char *)&local_418,(ulong)local_2e0);
                      }
                      local_3c0._0_8_ = local_3b0;
                      pSVar41 = (SPIRVariable *)(plVar31 + 2);
                      if ((SPIRVariable *)*plVar31 == pSVar41) {
                        local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                        local_3b0._8_8_ = plVar31[3];
                      }
                      else {
                        local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                        local_3c0._0_8_ = (SPIRVariable *)*plVar31;
                      }
                      local_3c0._8_8_ = plVar31[1];
                      *plVar31 = (long)pSVar41;
                      plVar31[1] = 0;
                      *(undefined1 *)&(pSVar41->super_IVariant)._vptr_IVariant = 0;
                      ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                      if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                        operator_delete((void *)local_3c0._0_8_);
                      }
                      if (local_2e0 != &local_2d0) {
                        operator_delete(local_2e0);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_418._M_dataplus._M_p != &local_418.field_2) {
                        operator_delete(local_418._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                        operator_delete(local_3f0._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_380._M_dataplus._M_p != &local_380.field_2) {
                        operator_delete(local_380._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_340._16_8_ != &local_320) {
                        operator_delete((void *)local_340._16_8_);
                      }
                      if (local_350 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_340) {
                        operator_delete(local_350);
                      }
                      if (local_298 != &local_288) {
                        operator_delete(local_298);
                      }
                      if ((__buckets_ptr *)local_2d0.field_2._M_allocated_capacity != &local_2b0) {
                        operator_delete((void *)local_2d0.field_2._M_allocated_capacity);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_268._M_dataplus._M_p != &local_268.field_2) {
                        operator_delete(local_268._M_dataplus._M_p);
                      }
                      uVar44 = *(int *)((long)&(pSVar48->array).buffer_capacity + 4) + uVar56;
                      cVar22 = '\x01';
                      if (9 < uVar44) {
                        uVar37 = uVar44;
                        cVar20 = '\x04';
                        do {
                          cVar22 = cVar20;
                          if (uVar37 < 100) {
                            cVar22 = cVar22 + -2;
                            goto LAB_0024f7aa;
                          }
                          if (uVar37 < 1000) {
                            cVar22 = cVar22 + -1;
                            goto LAB_0024f7aa;
                          }
                          if (uVar37 < 10000) goto LAB_0024f7aa;
                          bVar21 = 99999 < uVar37;
                          uVar37 = uVar37 / 10000;
                          cVar20 = cVar22 + '\x04';
                        } while (bVar21);
                        cVar22 = cVar22 + '\x01';
                      }
LAB_0024f7aa:
                      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                      ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
                      ::std::__detail::__to_chars_10_impl<unsigned_int>
                                (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar44)
                      ;
                      puVar29 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_3f0,0,(char *)0x0,0x39558f);
                      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                      psVar38 = puVar29 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar29 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar38) {
                        local_418.field_2._M_allocated_capacity = *psVar38;
                        local_418.field_2._8_8_ = puVar29[3];
                      }
                      else {
                        local_418.field_2._M_allocated_capacity = *psVar38;
                        local_418._M_dataplus._M_p = (pointer)*puVar29;
                      }
                      local_418._M_string_length = puVar29[1];
                      *puVar29 = psVar38;
                      puVar29[1] = 0;
                      *(undefined1 *)(puVar29 + 2) = 0;
                      plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
                      pSVar30 = local_308;
                      local_3c0._0_8_ = local_3b0;
                      pSVar32 = (SPIRType *)(plVar31 + 2);
                      if ((SPIRType *)*plVar31 == pSVar32) {
                        local_3b0._0_8_ = (pSVar32->super_IVariant)._vptr_IVariant;
                        local_3b0._8_8_ = plVar31[3];
                      }
                      else {
                        local_3b0._0_8_ = (pSVar32->super_IVariant)._vptr_IVariant;
                        local_3c0._0_8_ = (SPIRType *)*plVar31;
                      }
                      local_3c0._8_8_ = plVar31[1];
                      *plVar31 = (long)pSVar32;
                      plVar31[1] = 0;
                      *(undefined1 *)(plVar31 + 2) = 0;
                      ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
                      if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
                        operator_delete((void *)local_3c0._0_8_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_418._M_dataplus._M_p != &local_418.field_2) {
                        operator_delete(local_418._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                        operator_delete(local_3f0._M_dataplus._M_p);
                      }
                      cVar27 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                       *)local_358,&local_3c4.id);
                      if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                          (__node_type *)0x0) {
                        ::std::__cxx11::string::append((char *)local_3f8);
                      }
                      ::std::__cxx11::string::append((char *)local_3f8);
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar23);
                  }
                }
                local_3d0->is_using_builtin_array = false;
              }
            }
            else {
              pp_Var35 = (pSVar48->super_IVariant)._vptr_IVariant;
              if (pp_Var35 == pp_Var6) {
                uVar23 = Compiler::get_decoration
                                   ((Compiler *)local_3d0,local_3c4,DecorationDescriptorSet);
                local_418._M_dataplus._M_p._0_4_ = uVar23;
                uVar23 = Compiler::get_decoration((Compiler *)pCVar18,local_3c4,Binding);
                paVar33 = &local_418.field_2;
                local_3f0._M_dataplus._M_p._0_4_ = uVar23;
                join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                          ((string *)local_3c0,(spirv_cross *)"spvBufferAliasSet",
                           (char (*) [18])&local_418,(uint *)"Binding",(char (*) [8])&local_3f0,
                           (uint *)in_R9);
                if (local_3f8->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3f8);
                }
                get_argument_address_space_abi_cxx11_
                          ((string *)(local_3b0 + 0x30),local_3d0,pSVar54);
                plVar31 = (long *)::std::__cxx11::string::append((char *)(local_3b0 + 0x30));
                local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                psVar38 = (size_type *)(plVar31 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar31 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar38) {
                  local_3f0.field_2._M_allocated_capacity = *psVar38;
                  local_3f0.field_2._8_8_ = plVar31[3];
                }
                else {
                  local_3f0.field_2._M_allocated_capacity = *psVar38;
                  local_3f0._M_dataplus._M_p = (pointer)*plVar31;
                }
                local_3f0._M_string_length = plVar31[1];
                *plVar31 = (long)psVar38;
                plVar31[1] = 0;
                *(undefined1 *)(plVar31 + 2) = 0;
                plVar31 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_3f0,local_3c0._0_8_);
                psVar38 = (size_type *)(plVar31 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar31 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar38) {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418.field_2._8_8_ = plVar31[3];
                  local_418._M_dataplus._M_p = (pointer)paVar33;
                }
                else {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418._M_dataplus._M_p = (pointer)*plVar31;
                }
                local_418._M_string_length = plVar31[1];
                *plVar31 = (long)psVar38;
                plVar31[1] = 0;
                *(undefined1 *)(plVar31 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_3f8,(ulong)local_418._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar33) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                  operator_delete(local_3f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p);
                }
                uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
                cVar22 = '\x01';
                if (9 < uVar56) {
                  uVar44 = uVar56;
                  cVar20 = '\x04';
                  do {
                    cVar22 = cVar20;
                    if (uVar44 < 100) {
                      cVar22 = cVar22 + -2;
                      goto LAB_00250401;
                    }
                    if (uVar44 < 1000) {
                      cVar22 = cVar22 + -1;
                      goto LAB_00250401;
                    }
                    if (uVar44 < 10000) goto LAB_00250401;
                    bVar21 = 99999 < uVar44;
                    uVar44 = uVar44 / 10000;
                    cVar20 = cVar22 + '\x04';
                  } while (bVar21);
                  cVar22 = cVar22 + '\x01';
                }
LAB_00250401:
                local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                ::std::__cxx11::string::_M_construct((ulong)(local_3b0 + 0x30),cVar22);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_380._M_dataplus._M_p,(uint)local_380._M_string_length,uVar56);
                puVar29 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)(local_3b0 + 0x30),0,(char *)0x0,0x39558f);
                local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar29 == paVar39) {
                  local_3f0.field_2._M_allocated_capacity = paVar39->_M_allocated_capacity;
                  local_3f0.field_2._8_8_ = puVar29[3];
                }
                else {
                  local_3f0.field_2._M_allocated_capacity = paVar39->_M_allocated_capacity;
                  local_3f0._M_dataplus._M_p = (pointer)*puVar29;
                }
                local_3f0._M_string_length = puVar29[1];
                *puVar29 = paVar39;
                puVar29[1] = 0;
                *(undefined1 *)(puVar29 + 2) = 0;
                puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3f0);
                psVar38 = puVar29 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar38) {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418.field_2._8_8_ = puVar29[3];
                  local_418._M_dataplus._M_p = (pointer)paVar33;
                }
                else {
                  local_418.field_2._M_allocated_capacity = *psVar38;
                  local_418._M_dataplus._M_p = (pointer)*puVar29;
                }
                local_418._M_string_length = puVar29[1];
                *puVar29 = psVar38;
                puVar29[1] = 0;
                *(undefined1 *)(puVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_3f8,(ulong)local_418._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar33) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                  operator_delete(local_3f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p);
                }
                cVar27 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_358,&local_3c4.id);
                if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::__cxx11::string::append((char *)local_3f8);
                }
                ::std::__cxx11::string::append((char *)local_3f8);
                if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                pp_Var35 = (pSVar48->super_IVariant)._vptr_IVariant;
              }
              pCVar18 = local_3d0;
              uVar56 = *(uint *)(pp_Var35 + 1);
              SmallVector<unsigned_int,_8UL>::reserve
                        ((SmallVector<unsigned_int,_8UL> *)local_310,
                         (local_3d0->buffer_aliases_discrete).super_VectorView<unsigned_int>.
                         buffer_size + 1);
              sVar4 = (pCVar18->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
              (pCVar18->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr[sVar4] = uVar56;
              (pCVar18->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size =
                   sVar4 + 1;
            }
          }
          break;
        case 0x10:
          if (local_3f8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          pSVar32 = Variant::get<spirv_cross::SPIRType>
                              ((local_3d0->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar54->super_IVariant).field_0xc);
          if (((pSVar32->basetype == Image) && ((pSVar32->image).dim == DimSubpassData)) &&
             ((local_3d0->msl_options).use_framebuffer_fetch_subpasses != false)) {
            if (((local_3d0->msl_options).platform == macOS) &&
               ((local_3d0->msl_options).msl_version < 0x4f4c)) {
              prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar36,"Framebuffer fetch on Mac is not supported before MSL 2.3.");
              *(undefined ***)prVar36 = &PTR__runtime_error_0048ff00;
              __cxa_throw(prVar36,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                      (&local_3f0,local_3d0,pSVar30,(ulong)local_3c4.id,0);
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = plVar31[3];
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_418._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            uVar11._0_4_ = pSVar48->basetype;
            uVar11._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar11);
            local_3c0._0_8_ = local_3b0;
            pSVar41 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar41) {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar41;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_002501e7;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_002501e7;
                }
                if (uVar44 < 10000) goto LAB_002501e7;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_002501e7:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x395349);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar41 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar41) {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar41;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
          }
          else {
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                      (&local_3f0,local_3d0,pSVar30,(ulong)local_3c4.id,0);
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = plVar31[3];
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_418._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            uVar8._0_4_ = pSVar48->basetype;
            uVar8._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar8);
            local_3c0._0_8_ = local_3b0;
            pSVar41 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar41) {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar41;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            if (*(int *)(pSVar48->array).stack_storage.aligned_char != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        ((string *)local_3c0,(spirv_cross *)local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(pSVar48->array).stack_storage,(uint *)pSVar41);
              ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
              if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                operator_delete((void *)local_3c0._0_8_);
              }
            }
            bVar21 = is_var_runtime_size_array(local_3d0,pSVar54);
            if (bVar21) {
              uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
              cVar22 = '\x01';
              if (9 < uVar56) {
                uVar44 = uVar56;
                cVar20 = '\x04';
                do {
                  cVar22 = cVar20;
                  if (uVar44 < 100) {
                    cVar22 = cVar22 + -2;
                    goto LAB_0024fa6d;
                  }
                  if (uVar44 < 1000) {
                    cVar22 = cVar22 + -1;
                    goto LAB_0024fa6d;
                  }
                  if (uVar44 < 10000) goto LAB_0024fa6d;
                  bVar21 = 99999 < uVar44;
                  uVar44 = uVar44 / 10000;
                  cVar20 = cVar22 + '\x04';
                } while (bVar21);
                cVar22 = cVar22 + '\x01';
              }
LAB_0024fa6d:
              local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
              puVar29 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558e);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              psVar38 = puVar29 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar29 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_418.field_2._M_allocated_capacity = *psVar38;
                local_418.field_2._8_8_ = puVar29[3];
              }
              else {
                local_418.field_2._M_allocated_capacity = *psVar38;
                local_418._M_dataplus._M_p = (pointer)*puVar29;
              }
              local_418._M_string_length = puVar29[1];
              *puVar29 = psVar38;
              puVar29[1] = 0;
              *(undefined1 *)(puVar29 + 2) = 0;
              plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
              local_3c0._0_8_ = local_3b0;
              pSVar41 = (SPIRVariable *)(plVar31 + 2);
              if ((SPIRVariable *)*plVar31 == pSVar41) {
                local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                local_3b0._8_8_ = plVar31[3];
              }
              else {
                local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                local_3c0._0_8_ = (SPIRVariable *)*plVar31;
              }
              local_3c0._8_8_ = plVar31[1];
              *plVar31 = (long)pSVar41;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            }
            else {
              uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
              cVar22 = '\x01';
              if (9 < uVar56) {
                uVar44 = uVar56;
                cVar20 = '\x04';
                do {
                  cVar22 = cVar20;
                  if (uVar44 < 100) {
                    cVar22 = cVar22 + -2;
                    goto LAB_0024fb65;
                  }
                  if (uVar44 < 1000) {
                    cVar22 = cVar22 + -1;
                    goto LAB_0024fb65;
                  }
                  if (uVar44 < 10000) goto LAB_0024fb65;
                  bVar21 = 99999 < uVar44;
                  uVar44 = uVar44 / 10000;
                  cVar20 = cVar22 + '\x04';
                } while (bVar21);
                cVar22 = cVar22 + '\x01';
              }
LAB_0024fb65:
              local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
              puVar29 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x3955a6);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              psVar38 = puVar29 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar29 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar38) {
                local_418.field_2._M_allocated_capacity = *psVar38;
                local_418.field_2._8_8_ = puVar29[3];
              }
              else {
                local_418.field_2._M_allocated_capacity = *psVar38;
                local_418._M_dataplus._M_p = (pointer)*puVar29;
              }
              local_418._M_string_length = puVar29[1];
              *puVar29 = psVar38;
              puVar29[1] = 0;
              *(undefined1 *)(puVar29 + 2) = 0;
              plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
              local_3c0._0_8_ = local_3b0;
              pSVar41 = (SPIRVariable *)(plVar31 + 2);
              if ((SPIRVariable *)*plVar31 == pSVar41) {
                local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                local_3b0._8_8_ = plVar31[3];
              }
              else {
                local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
                local_3c0._0_8_ = (SPIRVariable *)*plVar31;
              }
              local_3c0._8_8_ = plVar31[1];
              *plVar31 = (long)pSVar41;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            }
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            cVar27 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_358,&local_3c4.id);
            if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::__cxx11::string::append((char *)local_3f8);
            }
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          local_3c0._0_4_ = (pSVar54->super_IVariant).self.id;
          cVar27 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_2f0,(key_type *)local_3c0);
          if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pBVar34 = ParsedIR::get_decoration_bitset
                                ((ParsedIR *)local_288.field_2._8_8_,
                                 (ID)(pSVar54->super_IVariant).self.id);
            pCVar18 = local_3d0;
            local_380._M_dataplus._M_p = "volatile ";
            if ((pBVar34->lower & 0xa00000) == 0) {
              local_380._M_dataplus._M_p = "";
            }
            pSVar30 = Variant::get<spirv_cross::SPIRType>
                                ((local_3d0->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar32->image).type.id);
            (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_418,pCVar18,pSVar30,0);
            paVar33 = &local_418.field_2;
            join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                      ((string *)local_3c0,(spirv_cross *)0x394b62,(char (*) [3])(local_3b0 + 0x30),
                       (char **)"device atomic_",(char (*) [15])&local_418,in_R9);
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar33) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            ::std::operator+(&local_418,"* ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pSVar48->basetype);
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar54 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar54) {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar54;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar33) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            uVar56 = *(uint *)((pSVar48->array).stack_storage.aligned_char + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_0024fea5;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_0024fea5;
                }
                if (uVar44 < 10000) goto LAB_0024fea5;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_0024fea5:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558f);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)paVar33;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar30 = (SPIRType *)(plVar31 + 2);
            if ((SPIRType *)*plVar31 == pSVar30) {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRType *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar30;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar33) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            cVar27 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_358,&local_3c4.id);
            if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::__cxx11::string::append((char *)local_3f8);
            }
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          break;
        default:
          if (local_3f8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          pCVar18 = local_3d0;
          if (pSVar30->pointer == false) {
            pSVar32 = Variant::get<spirv_cross::SPIRType>
                                ((local_3d0->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar54->super_IVariant).field_0xc);
            get_type_address_space_abi_cxx11_
                      ((string *)(local_340 + 0x10),pCVar18,pSVar32,local_3c4.id,false);
            plVar31 = (long *)::std::__cxx11::string::append((char *)(local_340 + 0x10));
            local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
            plVar40 = plVar31 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar40) {
              local_380.field_2._M_allocated_capacity = *plVar40;
              local_380.field_2._8_8_ = plVar31[3];
            }
            else {
              local_380.field_2._M_allocated_capacity = *plVar40;
              local_380._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_380._M_string_length = plVar31[1];
            *plVar31 = (long)plVar40;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_350,local_3d0,pSVar30,(ulong)local_3c4.id);
            uVar51 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              uVar51 = local_380.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar51 < (pointer)(local_348 + local_380._M_string_length)) {
              in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340
              ;
              pcVar53 = (pointer)0xf;
              if (local_350 != in_R9) {
                pcVar53 = (pointer)local_340._0_8_;
              }
              if (pcVar53 < (pointer)(local_348 + local_380._M_string_length)) goto LAB_0024e508;
              puVar29 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_350,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p
                                  );
            }
            else {
LAB_0024e508:
              puVar29 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_3b0 + 0x30,(ulong)local_350);
            }
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 == paVar33) {
              local_3f0.field_2._M_allocated_capacity = paVar33->_M_allocated_capacity;
              local_3f0.field_2._8_8_ = puVar29[3];
            }
            else {
              local_3f0.field_2._M_allocated_capacity = paVar33->_M_allocated_capacity;
              local_3f0._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_3f0._M_string_length = puVar29[1];
            *puVar29 = paVar33;
            puVar29[1] = 0;
            paVar33->_M_local_buf[0] = '\0';
            puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3f0);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            uVar10._0_4_ = pSVar48->basetype;
            uVar10._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar10);
            local_3c0._0_8_ = local_3b0;
            pSVar54 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar54) {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar54;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            if (local_350 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340) {
              operator_delete(local_350);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p);
            }
            paVar33 = &local_320;
            _Var52._M_p = (pointer)local_340._16_8_;
          }
          else {
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_3f0,local_3d0,pSVar30,(ulong)local_3c4.id);
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = plVar31[3];
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_418._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            uVar9._0_4_ = pSVar48->basetype;
            uVar9._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar9);
            local_3c0._0_8_ = local_3b0;
            pSVar54 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar54) {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar54;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            paVar33 = &local_3f0.field_2;
            _Var52._M_p = local_3f0._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var52._M_p != paVar33) {
            operator_delete(_Var52._M_p);
          }
          uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
          cVar22 = '\x01';
          if (9 < uVar56) {
            uVar44 = uVar56;
            cVar20 = '\x04';
            do {
              cVar22 = cVar20;
              if (uVar44 < 100) {
                cVar22 = cVar22 + -2;
                goto LAB_0024eaba;
              }
              if (uVar44 < 1000) {
                cVar22 = cVar22 + -1;
                goto LAB_0024eaba;
              }
              if (uVar44 < 10000) goto LAB_0024eaba;
              bVar21 = 99999 < uVar44;
              uVar44 = uVar44 / 10000;
              cVar20 = cVar22 + '\x04';
            } while (bVar21);
            cVar22 = cVar22 + '\x01';
          }
LAB_0024eaba:
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
          plVar31 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_3f0,0,(char *)0x0,0x39558f);
          psVar38 = (size_type *)(plVar31 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar31 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418.field_2._8_8_ = plVar31[3];
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418._M_dataplus._M_p = (pointer)*plVar31;
          }
          local_418._M_string_length = plVar31[1];
          *plVar31 = (long)psVar38;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
          local_3c0._0_8_ = local_3b0;
          pSVar30 = (SPIRType *)(plVar31 + 2);
          if ((SPIRType *)*plVar31 == pSVar30) {
            local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar31[3];
          }
          else {
            local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRType *)*plVar31;
          }
          local_3c0._8_8_ = plVar31[1];
          *plVar31 = (long)pSVar30;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
            operator_delete(local_3f0._M_dataplus._M_p);
          }
          cVar27 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_358,&local_3c4.id);
          if (cVar27.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          ::std::__cxx11::string::append((char *)local_3f8);
          break;
        case 0x12:
          if (local_3f8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f8);
          }
          sampler_type_abi_cxx11_(&local_3f0,local_3d0,pSVar30,local_3c4.id,false);
          plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
          psVar38 = (size_type *)(plVar31 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar31 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar38) {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418.field_2._8_8_ = plVar31[3];
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar38;
            local_418._M_dataplus._M_p = (pointer)*plVar31;
          }
          local_418._M_string_length = plVar31[1];
          *plVar31 = (long)psVar38;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          uVar7._0_4_ = pSVar48->basetype;
          uVar7._4_4_ = pSVar48->width;
          plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar7);
          local_3c0._0_8_ = local_3b0;
          pSVar41 = (SPIRVariable *)(plVar31 + 2);
          if ((SPIRVariable *)*plVar31 == pSVar41) {
            local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar31[3];
          }
          else {
            local_3b0._0_8_ = (pSVar41->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar31;
          }
          local_3c0._8_8_ = plVar31[1];
          *plVar31 = (long)pSVar41;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
            operator_delete(local_3f0._M_dataplus._M_p);
          }
          bVar21 = is_var_runtime_size_array(local_3d0,pSVar54);
          if (bVar21) {
            uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_0024edc4;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_0024edc4;
                }
                if (uVar44 < 10000) goto LAB_0024edc4;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_0024edc4:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558e);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar30 = (SPIRType *)(plVar31 + 2);
            if ((SPIRType *)*plVar31 == pSVar30) {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRType *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar30;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          }
          else {
            uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_0024eeb8;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_0024eeb8;
                }
                if (uVar44 < 10000) goto LAB_0024eeb8;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_0024eeb8:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39559a);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar30 = (SPIRType *)(plVar31 + 2);
            if ((SPIRType *)*plVar31 == pSVar30) {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRType *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar30;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          }
          goto LAB_0024f18d;
        case 0x13:
          bVar21 = is_var_runtime_size_array(local_3d0,pSVar54);
          if (bVar21) {
            add_spv_func_and_recompile(local_3d0,SPVFuncImplVariableDescriptor);
            pSVar30 = Variant::get<spirv_cross::SPIRType>
                                ((local_3d0->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar30->parent_type).id);
            if (local_3f8->_M_string_length != 0) {
              ::std::__cxx11::string::append((char *)local_3f8);
            }
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_350,local_3d0,pSVar30,0);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,0x395572);
            local_340._16_8_ = &local_320;
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar29 + 2);
            paVar33 = &local_418.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 == paVar39) {
              local_320._M_allocated_capacity = paVar39->_M_allocated_capacity;
              local_320._8_8_ = puVar29[3];
            }
            else {
              local_320._M_allocated_capacity = paVar39->_M_allocated_capacity;
              local_340._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar29;
            }
            local_340._24_8_ = puVar29[1];
            *puVar29 = paVar39;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            puVar29 = (undefined8 *)::std::__cxx11::string::append(local_340 + 0x10);
            local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
            plVar31 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar31) {
              local_380.field_2._M_allocated_capacity = *plVar31;
              local_380.field_2._8_8_ = puVar29[3];
            }
            else {
              local_380.field_2._M_allocated_capacity = *plVar31;
              local_380._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_380._M_string_length = puVar29[1];
            *puVar29 = plVar31;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            to_restrict(local_3d0,local_3c4.id,true);
            plVar31 = (long *)::std::__cxx11::string::append(local_3b0 + 0x30);
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_3f0.field_2._M_allocated_capacity = *psVar38;
              local_3f0.field_2._8_8_ = plVar31[3];
            }
            else {
              local_3f0.field_2._M_allocated_capacity = *psVar38;
              local_3f0._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_3f0._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            uVar55._0_4_ = pSVar48->basetype;
            uVar55._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_3f0,uVar55);
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = plVar31[3];
              local_418._M_dataplus._M_p = (pointer)paVar33;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_418._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar54 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar54) {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar54;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar33) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._16_8_ != &local_320) {
              operator_delete((void *)local_340._16_8_);
            }
            if (local_350 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340) {
              operator_delete(local_350);
            }
            uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_0024f0a0;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_0024f0a0;
                }
                if (uVar44 < 10000) goto LAB_0024f0a0;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_0024f0a0:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558f);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)paVar33;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar30 = (SPIRType *)(plVar31 + 2);
            if ((SPIRType *)*plVar31 == pSVar30) {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRType *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar30;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          }
          else {
            if (local_3f8->_M_string_length != 0) {
              ::std::__cxx11::string::append((char *)local_3f8);
            }
            (*(local_3d0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_3f0,local_3d0,pSVar30,(ulong)local_3c4.id);
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_3f0);
            paVar33 = &local_418.field_2;
            psVar38 = (size_type *)(plVar31 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar31 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = plVar31[3];
              local_418._M_dataplus._M_p = (pointer)paVar33;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*plVar31;
            }
            local_418._M_string_length = plVar31[1];
            *plVar31 = (long)psVar38;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            uVar58._0_4_ = pSVar48->basetype;
            uVar58._4_4_ = pSVar48->width;
            plVar31 = (long *)::std::__cxx11::string::_M_append((char *)&local_418,uVar58);
            local_3c0._0_8_ = local_3b0;
            pSVar54 = (SPIRVariable *)(plVar31 + 2);
            if ((SPIRVariable *)*plVar31 == pSVar54) {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar54->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar54;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar33) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p);
            }
            uVar56 = *(uint *)((long)&(pSVar48->array).buffer_capacity + 4);
            cVar22 = '\x01';
            if (9 < uVar56) {
              uVar44 = uVar56;
              cVar20 = '\x04';
              do {
                cVar22 = cVar20;
                if (uVar44 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_0024efac;
                }
                if (uVar44 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_0024efac;
                }
                if (uVar44 < 10000) goto LAB_0024efac;
                bVar21 = 99999 < uVar44;
                uVar44 = uVar44 / 10000;
                cVar20 = cVar22 + '\x04';
              } while (bVar21);
              cVar22 = cVar22 + '\x01';
            }
LAB_0024efac:
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3f0._M_dataplus._M_p,(uint)local_3f0._M_string_length,uVar56);
            puVar29 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x39558f);
            psVar38 = puVar29 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar38) {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418.field_2._8_8_ = puVar29[3];
              local_418._M_dataplus._M_p = (pointer)paVar33;
            }
            else {
              local_418.field_2._M_allocated_capacity = *psVar38;
              local_418._M_dataplus._M_p = (pointer)*puVar29;
            }
            local_418._M_string_length = puVar29[1];
            *puVar29 = psVar38;
            puVar29[1] = 0;
            *(undefined1 *)(puVar29 + 2) = 0;
            plVar31 = (long *)::std::__cxx11::string::append((char *)&local_418);
            local_3c0._0_8_ = local_3b0;
            pSVar30 = (SPIRType *)(plVar31 + 2);
            if ((SPIRType *)*plVar31 == pSVar30) {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar31[3];
            }
            else {
              local_3b0._0_8_ = (pSVar30->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRType *)*plVar31;
            }
            local_3c0._8_8_ = plVar31[1];
            *plVar31 = (long)pSVar30;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f8,local_3c0._0_8_);
          }
LAB_0024f18d:
          if ((SPIRType *)local_3c0._0_8_ != (SPIRType *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
            operator_delete(local_3f0._M_dataplus._M_p);
          }
        }
        pSVar48 = (SPIRType *)((pSVar48->array).stack_storage.aligned_char + 8);
      } while (pSVar48 != local_360);
    }
  }
  SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_248);
  return;
code_r0x0024d806:
  bVar21 = uVar58 < 3;
  uVar58 = uVar55;
  if (bVar21) goto LAB_0024d80f;
  goto LAB_0024d7eb;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *discrete_descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	entry_point_bindings.clear();
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);
			uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				if (descriptor_set_is_argument_buffer(desc_set))
				{
					if (is_var_runtime_size_array(var))
					{
						// Runtime arrays need to be wrapped in spvDescriptorArray from argument buffer payload.
						entry_point_bindings.push_back(&var);
						// We'll wrap this, so to_name() will always use non-qualified name.
						// We'll need the qualified name to create temporary variable instead.
						ir.meta[var_id].decoration.qualified_alias_explicit_override = true;
					}
					return;
				}
			}

			// Handle descriptor aliasing of simple discrete cases.
			// We can handle aliasing of buffers by casting pointers.
			// The amount of aliasing we can perform for discrete descriptors is very limited.
			// For fully mutable-style aliasing, we need argument buffers where we can exploit the fact
			// that descriptors are all 8 bytes.
			SPIRVariable *discrete_descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						discrete_descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.discrete_descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars_emulated.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				entry_point_bindings.push_back(&var);
				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), SPIRType::Image,
					                     get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({&var, discrete_descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                     get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!discrete_descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				entry_point_bindings.push_back(&var);
				resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), type.basetype,
				                     resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(),
	            [](const Resource &lhs, const Resource &rhs)
	            { return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index); });

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.discrete_descriptor_alias)
			{
				if (r.var == r.discrete_descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				is_using_builtin_array = true;
				if (is_var_runtime_size_array(var))
				{
					add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
					if (!ep_args.empty())
						ep_args += ", ";
					const bool ssbo = has_decoration(type.self, DecorationBufferBlock);
					if ((var.storage == spv::StorageClassStorageBuffer || ssbo) &&
					    msl_options.runtime_array_rich_descriptor)
					{
						add_spv_func_and_recompile(SPVFuncImplVariableSizedDescriptor);
						ep_args += "const device spvBufferDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					else
					{
						add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
						ep_args += "const device spvDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					ep_args += to_restrict(var_id, true) + r.name + "_";
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				else
				{
					uint32_t array_size = get_resource_array_size(type, var_id);
					for (uint32_t i = 0; i < array_size; ++i)
					{
						if (!ep_args.empty())
							ep_args += ", ";
						ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " +
						           to_restrict(var_id, true) + r.name + "_" + convert_to_string(i);
						ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
						if (interlocked_resources.count(var_id))
							ep_args += ", raster_order_group(0)";
						ep_args += "]]";
					}
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += get_argument_address_space(var) + " ";

				if (recursive_inputs.count(type.self))
					ep_args += string("void* ") + to_restrict(var_id, true) + r.name + "_vp";
				else
					ep_args += type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;

				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id, false) + " " + r.name;
			if (is_var_runtime_size_array(var))
				ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")]]";
			else
				ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);

				if (is_var_runtime_size_array(var))
					ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")";
				else
					ep_args += " [[texture(" + convert_to_string(r.index) + ")";

				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars_emulated.count(var.self))
			{
				auto &flags = ir.get_decoration_bitset(var.self);
				const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
				ep_args += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(basetype.image.type), 0));
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
		{
			if (is_var_runtime_size_array(var))
			{
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
				const auto &parent_type = get<SPIRType>(type.parent_type);
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += "const device spvDescriptor<" + type_to_glsl(parent_type) + ">* " +
				           to_restrict(var_id, true) + r.name + "_";
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			break;
		}
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}